

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  
  pbVar4 = (byte *)(ptr + ((long)end - (long)ptr & 0xfffffffffffffffe));
  if (((long)end - (long)ptr & 1U) == 0) {
    pbVar4 = (byte *)end;
  }
  if (pbVar4 != (byte *)ptr) {
    iVar5 = 0;
    do {
      bVar1 = *ptr;
      if (0xdb < bVar1) {
        iVar2 = 0;
        if (bVar1 == 0xff) {
          if (0xfd < ((byte *)ptr)[1]) {
switchD_004e1062_caseD_0:
            *nextTokPtr = ptr;
            return iVar2;
          }
        }
        else if (bVar1 - 0xdc < 4) goto switchD_004e1062_caseD_0;
        goto switchD_004e1062_caseD_3;
      }
      if (bVar1 - 0xd8 < 4) {
switchD_004e1062_caseD_7:
        if ((long)pbVar4 - (long)ptr < 4) {
          return -2;
        }
        pbVar3 = (byte *)ptr + 4;
        goto LAB_004e10dd;
      }
      if (bVar1 != 0) goto switchD_004e1062_caseD_3;
      iVar2 = 0;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
      case 0:
      case 1:
      case 8:
        goto switchD_004e1062_caseD_0;
      case 2:
        pbVar3 = (byte *)ptr + 2;
        if (pbVar3 == pbVar4) {
          return -1;
        }
        if ((*pbVar3 == 0) && (((byte *)ptr)[3] == 0x21)) {
          pbVar3 = (byte *)ptr + 4;
          if (pbVar3 == pbVar4) {
            return -1;
          }
          if ((*pbVar3 == 0) && (((byte *)ptr)[5] == 0x5b)) {
            iVar5 = iVar5 + 1;
            pbVar3 = (byte *)ptr + 6;
          }
        }
        break;
      case 4:
        pbVar3 = (byte *)ptr + 2;
        if (pbVar3 == pbVar4) {
          return -1;
        }
        if ((*pbVar3 == 0) && (((byte *)ptr)[3] == 0x5d)) {
          pbVar3 = (byte *)ptr + 4;
          if (pbVar3 == pbVar4) {
            return -1;
          }
          if ((*pbVar3 == 0) && (((byte *)ptr)[5] == 0x3e)) {
            ptr = (char *)((byte *)ptr + 6);
            if (iVar5 == 0) {
              iVar2 = 0x2a;
              goto switchD_004e1062_caseD_0;
            }
            iVar5 = iVar5 + -1;
            pbVar3 = (byte *)ptr;
          }
        }
        break;
      case 5:
        if ((long)pbVar4 - (long)ptr < 2) {
          return -2;
        }
      default:
switchD_004e1062_caseD_3:
        pbVar3 = (byte *)ptr + 2;
        break;
      case 6:
        if ((long)pbVar4 - (long)ptr < 3) {
          return -2;
        }
        pbVar3 = (byte *)ptr + 3;
        break;
      case 7:
        goto switchD_004e1062_caseD_7;
      }
LAB_004e10dd:
      ptr = (char *)pbVar3;
    } while (pbVar3 != pbVar4);
  }
  return -1;
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}